

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_dquo
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel)

{
  size_t *psVar1;
  ulong uVar2;
  byte bVar3;
  code *pcVar4;
  bool bVar5;
  error_flags eVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong start;
  ulong uVar10;
  long lVar11;
  ro_substr chars;
  basic_substring<const_char> local_68;
  basic_substring<const_char> local_58;
  long local_48;
  size_t local_40;
  ulong local_38;
  
  uVar8 = s.len;
  local_68.str = s.str;
  local_68.len = uVar8;
  std::ostream::put((char)(this->
                          super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).m_stream);
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + 1;
  if (uVar8 != 0) {
    local_48 = ilevel + 1;
    uVar9 = 0;
    start = 0;
    local_40 = ilevel;
    do {
      bVar3 = local_68.str[start];
      if (bVar3 < 0x20) {
        if (bVar3 == 10) {
          if (uVar8 < uVar9) {
            eVar6 = get_error_flags();
            if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
              pcVar4 = (code *)swi(3);
              (*pcVar4)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          uVar2 = start + 1;
          uVar10 = uVar2;
          if (uVar2 == 0xffffffffffffffff) {
            uVar10 = uVar8;
          }
          local_38 = uVar9;
          if (uVar10 < uVar9) {
            eVar6 = get_error_flags();
            if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
              pcVar4 = (code *)swi(3);
              (*pcVar4)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (uVar8 < uVar10) {
            eVar6 = get_error_flags();
            if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
              pcVar4 = (code *)swi(3);
              (*pcVar4)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_58,local_68.str + uVar9,uVar10 - uVar9);
          sVar7 = local_58.len;
          if (local_58.str != (char *)0x0 && local_58.len != 0) {
            std::ostream::write((char *)(this->
                                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ).m_stream,(long)local_58.str);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + sVar7;
          }
          bVar5 = local_40 != 0xffffffffffffffff;
          std::ostream::put((char)(this->
                                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 1;
          lVar11 = local_48;
          if (uVar2 < local_68.len && bVar5) {
            do {
              std::ostream::put((char)(this->
                                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream);
              psVar1 = &(this->
                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).m_pos;
              *psVar1 = *psVar1 + 1;
              std::ostream::put((char)(this->
                                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream);
              psVar1 = &(this->
                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).m_pos;
              *psVar1 = *psVar1 + 1;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
          uVar9 = uVar2;
          if ((uVar2 < local_68.len) &&
             ((local_68.str[uVar2] == ' ' || (local_68.str[uVar2] == '\t')))) {
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
          }
        }
        else {
          if (bVar3 == 9) goto LAB_001979d7;
          if (bVar3 == 0xd) {
            if (uVar8 < uVar9) {
              eVar6 = get_error_flags();
              if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
                pcVar4 = (code *)swi(3);
                (*pcVar4)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1544,"first >= 0 && first <= len");
            }
            if (start < uVar9) {
              eVar6 = get_error_flags();
              if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
                pcVar4 = (code *)swi(3);
                (*pcVar4)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1546,"first <= last");
            }
            if (uVar8 < start) {
              eVar6 = get_error_flags();
              if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
                pcVar4 = (code *)swi(3);
                (*pcVar4)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1547,"last >= 0 && last <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_58,local_68.str + uVar9,start - uVar9);
            sVar7 = local_58.len;
            if (local_58.str != (char *)0x0 && local_58.len != 0) {
              std::ostream::write((char *)(this->
                                          super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ).m_stream,(long)local_58.str);
              psVar1 = &(this->
                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).m_pos;
              *psVar1 = *psVar1 + sVar7;
            }
            std::ostream::write((char *)(this->
                                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ).m_stream,0x1f5e55);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 2;
            goto LAB_0019782a;
          }
        }
      }
      else if ((bVar3 == 0x22) || (bVar3 == 0x5c)) {
        if (uVar8 < uVar9) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x1f8007,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        if (start < uVar9) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x1f8007,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (local_68.len < start) {
          eVar6 = get_error_flags();
          if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
            pcVar4 = (code *)swi(3);
            (*pcVar4)();
            return;
          }
          handle_error(0x1f8007,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_58,local_68.str + uVar9,start - uVar9);
        sVar7 = local_58.len;
        if (local_58.str != (char *)0x0 && local_58.len != 0) {
          std::ostream::write((char *)(this->
                                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream,(long)local_58.str);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + sVar7;
        }
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
LAB_0019782a:
        uVar9 = start + 1;
      }
      else if (bVar3 == 0x20) {
LAB_001979d7:
        chars.len = 3;
        chars.str = " \t\r";
        sVar7 = basic_substring<const_char>::first_not_of(&local_68,chars,start);
        if (sVar7 != 0xffffffffffffffff) {
          if (local_68.len <= sVar7) {
            eVar6 = get_error_flags();
            if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
              pcVar4 = (code *)swi(3);
              (*pcVar4)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x14c3,"i >= 0 && i < len");
          }
          if (local_68.str[sVar7] == '\n') {
            if (local_68.len < uVar9) {
              eVar6 = get_error_flags();
              if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
                pcVar4 = (code *)swi(3);
                (*pcVar4)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1544,"first >= 0 && first <= len");
            }
            if (start < uVar9) {
              eVar6 = get_error_flags();
              if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
                pcVar4 = (code *)swi(3);
                (*pcVar4)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1546,"first <= last");
            }
            if (local_68.len < start) {
              eVar6 = get_error_flags();
              if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
                pcVar4 = (code *)swi(3);
                (*pcVar4)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1547,"last >= 0 && last <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_58,local_68.str + uVar9,start - uVar9);
            sVar7 = local_58.len;
            if (local_58.str != (char *)0x0 && local_58.len != 0) {
              std::ostream::write((char *)(this->
                                          super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ).m_stream,(long)local_58.str);
              psVar1 = &(this->
                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).m_pos;
              *psVar1 = *psVar1 + sVar7;
            }
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            uVar9 = start;
          }
        }
      }
      start = start + 1;
      uVar8 = local_68.len;
    } while (start < local_68.len);
    if ((uVar9 <= local_68.len && local_68.len - uVar9 != 0) &&
       (basic_substring<const_char>::basic_substring
                  (&local_58,local_68.str + uVar9,local_68.len - uVar9),
       local_58.str != (char *)0x0 && local_58.len != 0)) {
      std::ostream::write((char *)(this->
                                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).m_stream,(long)local_58.str);
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + local_58.len;
    }
  }
  std::ostream::put((char)(this->
                          super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).m_stream);
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_dquo(csubstr s, size_t ilevel)
{
    size_t pos = 0; // tracks the last character that was already written
    this->Writer::_do_write('"');
    for(size_t i = 0; i < s.len; ++i)
    {
        const char curr = s.str[i];
        if(curr == '"' || curr == '\\')
        {
            csubstr sub = s.range(pos, i);
            this->Writer::_do_write(sub);  // write everything up to (excluding) this char
            this->Writer::_do_write('\\'); // write the escape
            this->Writer::_do_write(curr); // write the char
            pos = i+1;
        }
        else if(s[i] == '\n')
        {
            csubstr sub = s.range(pos, i+1);
            this->Writer::_do_write(sub);  // write everything up to (including) this newline
            this->Writer::_do_write('\n'); // write the newline again
            if(i + 1 < s.len)
                _rymlindent_nextline()     // indent the next line
            pos = i+1;
            if(i+1 < s.len) // escape leading whitespace after the newline
            {
                const char next = s.str[i+1];
                if(next == ' ' || next == '\t')
                    this->Writer::_do_write('\\');
            }
        }
        else if(curr == ' ' || curr == '\t')
        {
            // escape trailing whitespace before a newline
            size_t next = s.first_not_of(" \t\r", i);
            if(next != npos && s[next] == '\n')
            {
                csubstr sub = s.range(pos, i);
                this->Writer::_do_write(sub);  // write everything up to (excluding) this char
                this->Writer::_do_write('\\'); // escape the whitespace
                pos = i;
            }
        }
        else if(C4_UNLIKELY(curr == '\r'))
        {
            csubstr sub = s.range(pos, i);
            this->Writer::_do_write(sub);  // write everything up to (excluding) this char
            this->Writer::_do_write("\\r"); // write the escaped char
            pos = i+1;
        }
    }
    // write missing characters at the end of the string
    if(pos < s.len)
    {
        csubstr sub = s.sub(pos);
        this->Writer::_do_write(sub);
    }
    this->Writer::_do_write('"');
}